

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcElementAssembly::IfcElementAssembly(IfcElementAssembly *this)

{
  IfcElementAssembly *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x190,"IfcElementAssembly");
  IfcElement::IfcElement(&this->super_IfcElement,&PTR_construction_vtable_24__00f6e9e8);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcElementAssembly,_2UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcElementAssembly,_2UL> *)
             &(this->super_IfcElement).field_0x138,&PTR_construction_vtable_24__00f6ead8);
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject = 0xf6e8e0;
  *(undefined8 *)&this->field_0x190 = 0xf6e9d0;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x88 = 0xf6e908;
  (this->super_IfcElement).super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0xf6e930;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0xd0 = 0xf6e958;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.field_0x100 = 0xf6e980;
  *(undefined8 *)&(this->super_IfcElement).field_0x138 = 0xf6e9a8;
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Maybe((Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &(this->super_IfcElement).field_0x148);
  std::__cxx11::string::string((string *)&this->PredefinedType);
  return;
}

Assistant:

IfcElementAssembly() : Object("IfcElementAssembly") {}